

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O3

lua_Integer unpackint(lua_State *L,char *str,int islittle,int size,int issigned)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  char cVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  
  uVar8 = 8;
  if (size < 8) {
    uVar8 = size;
  }
  if (size < 1) {
    uVar9 = 0;
  }
  else {
    iVar2 = uVar8 + 1;
    iVar5 = size - uVar8;
    uVar9 = 0;
    do {
      uVar6 = uVar9 << 8;
      iVar1 = iVar2 + -2;
      if (islittle == 0) {
        iVar1 = iVar5;
      }
      iVar2 = iVar2 + -1;
      iVar5 = iVar5 + 1;
      uVar9 = (byte)str[iVar1] | uVar6;
    } while (1 < iVar2);
    if (7 < size) {
      if (size == 8) {
        return uVar9;
      }
      cVar4 = -1;
      if (-1 < (long)uVar6) {
        cVar4 = '\0';
      }
      if (issigned == 0) {
        cVar4 = '\0';
      }
      uVar7 = ~uVar8 + size;
      do {
        uVar3 = uVar8;
        if (islittle == 0) {
          uVar3 = uVar7;
        }
        if (cVar4 != str[(int)uVar3]) {
          luaL_error(L,"%d-byte integer does not fit into Lua Integer",(ulong)(uint)size);
        }
        uVar8 = uVar8 + 1;
        uVar7 = uVar7 - 1;
      } while ((int)uVar8 < size);
      return uVar9;
    }
  }
  if (issigned != 0) {
    uVar6 = (ulong)(byte)((char)(size << 3) - 1);
    uVar9 = (uVar9 ^ 1L << (uVar6 & 0x3f)) - (1L << (uVar6 & 0x3f));
  }
  return uVar9;
}

Assistant:

static lua_Integer unpackint (lua_State *L, const char *str,
                              int islittle, int size, int issigned) {
  lua_Unsigned res = 0;
  int i;
  int limit = (size  <= SZINT) ? size : SZINT;
  for (i = limit - 1; i >= 0; i--) {
    res <<= NB;
    res |= (lua_Unsigned)(unsigned char)str[islittle ? i : size - 1 - i];
  }
  if (size < SZINT) {  /* real size smaller than lua_Integer? */
    if (issigned) {  /* needs sign extension? */
      lua_Unsigned mask = (lua_Unsigned)1 << (size*NB - 1);
      res = ((res ^ mask) - mask);  /* do sign extension */
    }
  }
  else if (size > SZINT) {  /* must check unread bytes */
    int mask = (!issigned || (lua_Integer)res >= 0) ? 0 : MC;
    for (i = limit; i < size; i++) {
      if ((unsigned char)str[islittle ? i : size - 1 - i] != mask)
        luaL_error(L, "%d-byte integer does not fit into Lua Integer", size);
    }
  }
  return (lua_Integer)res;
}